

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# getkey.c
# Opt level: O0

int ffgnky(fitsfile *fptr,char *card,int *status)

{
  long lVar1;
  int iVar2;
  int *status_00;
  int *in_RDX;
  undefined1 *in_RSI;
  int *in_RDI;
  bool bVar3;
  char message [81];
  LONGLONG endhead;
  LONGLONG bytepos;
  int nrec;
  int jj;
  char local_98 [4];
  int in_stack_ffffffffffffff6c;
  LONGLONG in_stack_ffffffffffffff70;
  fitsfile *in_stack_ffffffffffffff78;
  int *in_stack_ffffffffffffffa0;
  void *in_stack_ffffffffffffffa8;
  LONGLONG in_stack_ffffffffffffffb0;
  fitsfile *in_stack_ffffffffffffffb8;
  int *in_stack_ffffffffffffffc0;
  int *in_stack_ffffffffffffffc8;
  undefined8 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffdc;
  int local_4;
  
  if (*in_RDX < 1) {
    if (*in_RDI != *(int *)(*(long *)(in_RDI + 2) + 0x54)) {
      ffmahd((fitsfile *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),
             (int)((ulong)in_stack_ffffffffffffffd0 >> 0x20),in_stack_ffffffffffffffc8,
             in_stack_ffffffffffffffc0);
    }
    *in_RSI = 0;
    lVar1 = *(long *)(*(long *)(in_RDI + 2) + 0x80);
    if (*(long *)(*(long *)(in_RDI + 2) + 0x88) + -0xb40 < *(long *)(*(long *)(in_RDI + 2) + 0x70))
    {
      status_00 = *(int **)(*(long *)(in_RDI + 2) + 0x70);
    }
    else {
      status_00 = (int *)(*(long *)(*(long *)(in_RDI + 2) + 0x88) + -0xb40);
    }
    if (((long)status_00 < lVar1) ||
       (lVar1 < *(long *)(*(long *)(*(long *)(in_RDI + 2) + 0x68) +
                         (long)*(int *)(*(long *)(in_RDI + 2) + 0x54) * 8))) {
      snprintf(local_98,0x51,"Cannot get keyword number %d.  It does not exist.",
               (ulong)((int)((lVar1 - *(long *)(*(long *)(*(long *)(in_RDI + 2) + 0x68) +
                                               (long)*(int *)(*(long *)(in_RDI + 2) + 0x54) * 8)) /
                            0x50) + 1));
      ffpmsg((char *)0x1bc106);
      *in_RDX = 0xcb;
      local_4 = 0xcb;
    }
    else {
      ffmbyt(in_stack_ffffffffffffff78,in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c,status_00
            );
      in_RSI[0x50] = 0;
      iVar2 = ffgbyt(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,
                     in_stack_ffffffffffffffa0);
      if (iVar2 < 1) {
        *(long *)(*(long *)(in_RDI + 2) + 0x80) = *(long *)(*(long *)(in_RDI + 2) + 0x80) + 0x50;
        iVar2 = 0x4f;
        while( true ) {
          bVar3 = false;
          if (-1 < iVar2) {
            bVar3 = in_RSI[iVar2] == ' ';
          }
          if (!bVar3) break;
          iVar2 = iVar2 + -1;
        }
        in_RSI[iVar2 + 1] = 0;
      }
      local_4 = *in_RDX;
    }
  }
  else {
    local_4 = *in_RDX;
  }
  return local_4;
}

Assistant:

int ffgnky(fitsfile *fptr,  /* I - FITS file pointer     */
           char *card,      /* O - card string           */
           int *status)     /* IO - error status         */
/*
  read the next keyword from the header - used internally by cfitsio
*/
{
    int jj, nrec;
    LONGLONG bytepos, endhead;
    char message[FLEN_ERRMSG];

    if (*status > 0)
        return(*status);

    if (fptr->HDUposition != (fptr->Fptr)->curhdu)
        ffmahd(fptr, (fptr->HDUposition) + 1, NULL, status);

    card[0] = '\0';  /* make sure card is terminated, even affer read error */

/*
  Check that nextkey points to a legal keyword position.  Note that headend
  is the current end of the header, i.e., the position where a new keyword
  would be appended, however, if there are more than 1 FITS block worth of
  blank keywords at the end of the header (36 keywords per 2880 byte block)
  then the actual physical END card must be located at a starting position
  which is just 2880 bytes prior to the start of the data unit.
*/

    bytepos = (fptr->Fptr)->nextkey;
    endhead = maxvalue( ((fptr->Fptr)->headend), ((fptr->Fptr)->datastart - 2880) );

    /* nextkey must be < endhead and > than  headstart */
    if (bytepos > endhead ||  
        bytepos < (fptr->Fptr)->headstart[(fptr->Fptr)->curhdu] ) 
    {
        nrec= (int) ((bytepos - (fptr->Fptr)->headstart[(fptr->Fptr)->curhdu]) / 80 + 1);
        snprintf(message, FLEN_ERRMSG,"Cannot get keyword number %d.  It does not exist.",
                nrec);
        ffpmsg(message);
        return(*status = KEY_OUT_BOUNDS);
    }
      
    ffmbyt(fptr, bytepos, REPORT_EOF, status);  /* move to read pos. */

    card[80] = '\0';  /* make sure card is terminate, even if ffgbyt fails */

    if (ffgbyt(fptr, 80, card, status) <= 0) 
    {
        (fptr->Fptr)->nextkey += 80;   /* increment pointer to next keyword */

        /* strip off trailing blanks with terminated string */
        jj = 79;
        while (jj >= 0 && card[jj] == ' ')
               jj--;

        card[jj + 1] = '\0';
    }
    return(*status);
}